

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O1

void __thiscall
SWDAnalyzerResults::GenerateExportFile
          (SWDAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char cVar3;
  ulonglong uVar4;
  int iVar5;
  ulonglong uVar6;
  bool bVar7;
  Frame f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  record;
  ofstream of;
  string local_2a8;
  ushort local_288;
  DisplayBase local_27c;
  SWDRequestFrame local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_27c = display_base;
  std::ofstream::ofstream(&local_230,file,_S_out);
  Analyzer::GetTriggerSample();
  Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,
             "Time\tType\tR/W\tAP/DP\tRegister\tRequest byte\tACK\tWData\tWData details",0x41);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  Frame::Frame(&local_278.super_Frame);
  uVar4 = AnalyzerResults::GetNumFrames();
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar4 != 0) {
    paVar1 = &local_2a8.field_2;
    uVar6 = 0;
    do {
      AnalyzerResults::GetFrame((ulonglong)&local_2a8);
      local_278._32_2_ = local_288;
      local_278._16_8_ = local_2a8.field_2._M_allocated_capacity;
      local_278._24_8_ = local_2a8.field_2._8_8_;
      local_278._0_8_ = local_2a8._M_dataplus._M_p;
      local_278._8_8_ = local_2a8._M_string_length;
      Frame::~Frame((Frame *)&local_2a8);
      switch(local_278._32_1_) {
      case (BADTYPE)0x2:
        SaveRecord(&local_248,(ofstream *)&local_230);
        GetSampleTimeStr_abi_cxx11_(&local_2a8,this,local_278._0_8_);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        local_2a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Line reset","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        SaveRecord(&local_248,(ofstream *)&local_230);
        break;
      case (BADTYPE)0x3:
        SaveRecord(&local_248,(ofstream *)&local_230);
        GetSampleTimeStr_abi_cxx11_(&local_2a8,this,local_278._0_8_);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        local_2a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Operation","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        iVar5 = 0x10e208;
        if ((local_278._32_2_ & 0x100) == 0) {
          iVar5 = 0x10e20d;
        }
        local_2a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,iVar5,((byte)local_278._33_1_ & 1 ^ 5) + iVar5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        bVar7 = (local_278._32_2_ & 0x200) == 0;
        pcVar2 = " AccessPort";
        if (bVar7) {
          pcVar2 = " DebugPort";
        }
        local_2a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,pcVar2 + 1,pcVar2 + 1 + (10 - (ulong)bVar7));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        SWDRequestFrame::GetRegisterName_abi_cxx11_(&local_2a8,&local_278);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        int2str_sal_abi_cxx11_(&local_2a8,local_278._16_8_,local_27c,8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        goto LAB_00108d44;
      case (BADTYPE)0x5:
        if (local_278._16_8_ == 4) {
          local_2a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"FAULT","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248
                     ,&local_2a8);
        }
        else if (local_278._16_8_ == 2) {
          local_2a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"WAIT","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248
                     ,&local_2a8);
        }
        else if (local_278._16_8_ == 1) {
          local_2a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"OK","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248
                     ,&local_2a8);
        }
        else {
          local_2a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"<disc>","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248
                     ,&local_2a8);
        }
LAB_00108d44:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        break;
      case (BADTYPE)0x6:
        int2str_sal_abi_cxx11_(&local_2a8,local_278._16_8_,local_27c,0x20);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        GetRegisterValueDesc_abi_cxx11_(&local_2a8,local_278._24_4_,local_278._16_4_,local_27c);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   &local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        SaveRecord(&local_248,(ofstream *)&local_230);
      }
      cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar6);
      if (cVar3 != '\0') goto LAB_00108d7e;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar4);
LAB_00108d7e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  Frame::~Frame(&local_278.super_Frame);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _SimulationChannelDescriptorGroup;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void SWDAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream of( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    of << "Time\tType\tR/W\tAP/DP\tRegister\tRequest byte\tACK\tWData\tWData details" << std::endl;

    Frame f;
    const U64 num_frames = GetNumFrames();
    std::vector<std::string> record;
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( f.mType == SWDFT_LineReset )
        {
            SaveRecord( record, of );

            record.push_back( GetSampleTimeStr( f.mStartingSampleInclusive ) );
            record.push_back( "Line reset" );
            SaveRecord( record, of );
        }
        else if( f.mType == SWDFT_Request )
        {
            SaveRecord( record, of );

            SWDRequestFrame& req( ( SWDRequestFrame& )f );
            record.push_back( GetSampleTimeStr( f.mStartingSampleInclusive ) );
            record.push_back( "Operation" );
            record.push_back( req.IsRead() ? "read" : "write" );
            record.push_back( req.IsAccessPort() ? "AccessPort" : "DebugPort" );
            record.push_back( req.GetRegisterName() );
            record.push_back( int2str_sal( req.mData1, display_base, 8 ) );
        }
        else if( f.mType == SWDFT_ACK )
        {
            if( f.mData1 == ACK_OK )
                record.push_back( "OK" );
            else if( f.mData1 == ACK_WAIT )
                record.push_back( "WAIT" );
            else if( f.mData1 == ACK_FAULT )
                record.push_back( "FAULT" );
            else
                record.push_back( "<disc>" );
        }
        else if( f.mType == SWDFT_WData )
        {
            record.push_back( int2str_sal( f.mData1, display_base, 32 ) );

            SWDRegisters reg( SWDRegisters( f.mData2 ) );
            record.push_back( GetRegisterValueDesc( reg, U32( f.mData1 ), display_base ) );

            SaveRecord( record, of );
        }

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;
    }

    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}